

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

NaReal __thiscall NaVector::metric(NaVector *this)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double local_18;
  
  local_18 = 0.0;
  uVar2 = 0;
  while( true ) {
    uVar1 = (*this->_vptr_NaVector[6])(this);
    if (uVar1 <= uVar2) break;
    local_18 = local_18 + this->pVect[uVar2] * this->pVect[uVar2];
    uVar2 = uVar2 + 1;
  }
  if (0.0 <= local_18) {
    return SQRT(local_18);
  }
  dVar3 = sqrt(local_18);
  return dVar3;
}

Assistant:

NaReal
NaVector::metric () const
{
    unsigned    i;
    NaReal      vMetric = 0.0;
    for(i = 0; i < dim(); ++i)
        vMetric += pVect[i] * pVect[i];
    return sqrt(vMetric);
}